

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# clip.cpp
# Opt level: O2

void image_manipulation::resize_and_pad_image
               (clip_image_u8 *image,clip_image_u8 *dst,clip_image_size *target_resolution,
               array<unsigned_char,_3UL> pad_color)

{
  undefined4 uVar1;
  clip_image_size cVar2;
  undefined4 uVar3;
  uint uVar4;
  int iVar5;
  ulong uVar6;
  ulong uVar7;
  ulong uVar8;
  ulong uVar9;
  int iVar10;
  int x;
  ulong uVar11;
  int target_width;
  ulong uVar12;
  int c;
  long lVar13;
  float fVar14;
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  int iVar17;
  uint uVar18;
  undefined1 local_88 [8];
  _Vector_base<unsigned_char,_std::allocator<unsigned_char>_> local_80;
  clip_image_u8 resized_image;
  
  cVar2 = *target_resolution;
  iVar17 = cVar2.width;
  uVar18 = cVar2.height;
  auVar15._0_4_ = (float)iVar17;
  auVar15._4_4_ = (float)(int)uVar18;
  auVar15._8_8_ = 0;
  uVar1 = image->nx;
  uVar3 = image->ny;
  auVar16._4_4_ = (float)(int)uVar3;
  auVar16._0_4_ = (float)(int)uVar1;
  auVar16._8_8_ = 0;
  auVar16 = divps(auVar15,auVar16);
  uVar6 = (ulong)cVar2 & 0xffffffff;
  uVar12 = uVar6;
  uVar4 = uVar18;
  if (auVar16._4_4_ <= auVar16._0_4_) {
    fVar14 = ceilf(auVar16._4_4_ * (float)(int)uVar1);
    uVar12 = (ulong)(uint)(int)fVar14;
    if (iVar17 < (int)fVar14) {
      uVar12 = uVar6;
    }
  }
  else {
    fVar14 = ceilf(auVar16._0_4_ * (float)(int)uVar3);
    uVar4 = (int)fVar14;
    if ((int)uVar18 < (int)fVar14) {
      uVar4 = uVar18;
    }
  }
  resized_image.buf.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  resized_image.buf.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  resized_image.buf.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  target_width = (int)uVar12;
  bicubic_resize(image,&resized_image,target_width,uVar4);
  local_80._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_80._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_80._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_88._0_4_ = iVar17;
  local_88._4_4_ = uVar18;
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&local_80,
             (long)(int)(iVar17 * uVar18 * 3));
  uVar6 = 0;
  while( true ) {
    if ((ulong)((long)local_80._M_impl.super__Vector_impl_data._M_finish -
               (long)local_80._M_impl.super__Vector_impl_data._M_start) <= uVar6) break;
    local_80._M_impl.super__Vector_impl_data._M_start[uVar6] = pad_color._M_elems[0];
    local_80._M_impl.super__Vector_impl_data._M_start[uVar6 + 1] = pad_color._M_elems[1];
    local_80._M_impl.super__Vector_impl_data._M_start[uVar6 + 2] = pad_color._M_elems[2];
    uVar6 = uVar6 + 3;
  }
  uVar7 = 0;
  uVar6 = 0;
  if (0 < target_width) {
    uVar6 = uVar12;
  }
  uVar12 = (ulong)uVar4;
  if ((int)uVar4 < 1) {
    uVar12 = uVar7;
  }
  iVar5 = (((int)(uVar18 - uVar4) / 2) * iVar17 + (iVar17 - target_width) / 2) * 3;
  for (uVar8 = 0; uVar8 != uVar12; uVar8 = uVar8 + 1) {
    uVar9 = uVar7;
    iVar10 = iVar5;
    for (uVar11 = 0; uVar11 != uVar6; uVar11 = uVar11 + 1) {
      for (lVar13 = 0; lVar13 != 3; lVar13 = lVar13 + 1) {
        local_80._M_impl.super__Vector_impl_data._M_start[lVar13 + iVar10] =
             resized_image.buf.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
             _M_impl.super__Vector_impl_data._M_start[lVar13 + uVar9];
      }
      iVar10 = iVar10 + 3;
      uVar9 = uVar9 + 3;
    }
    iVar5 = iVar5 + iVar17 * 3;
    uVar7 = uVar7 + (long)target_width * 3;
  }
  clip_image_u8::operator=(dst,(clip_image_u8 *)local_88);
  std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base(&local_80);
  std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
            (&resized_image.buf.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>);
  return;
}

Assistant:

static void resize_and_pad_image(const clip_image_u8 & image, clip_image_u8 & dst, const clip_image_size & target_resolution, std::array<uint8_t, 3> pad_color = {0, 0, 0}) {
        int target_width  = target_resolution.width;
        int target_height = target_resolution.height;

        float scale_w = static_cast<float>(target_width) / image.nx;
        float scale_h = static_cast<float>(target_height) / image.ny;

        int new_width, new_height;

        if (scale_w < scale_h) {
            new_width  = target_width;
            new_height = std::min(static_cast<int>(std::ceil(image.ny * scale_w)), target_height);
        } else {
            new_height = target_height;
            new_width  = std::min(static_cast<int>(std::ceil(image.nx * scale_h)), target_width);
        }

        clip_image_u8 resized_image;
        bicubic_resize(image, resized_image, new_width, new_height);

        clip_image_u8 padded_image;
        padded_image.nx = target_width;
        padded_image.ny = target_height;
        padded_image.buf.resize(3 * target_width * target_height);

        // Fill the padded image with the fill color
        for (size_t i = 0; i < padded_image.buf.size(); i += 3) {
            padded_image.buf[i]     = pad_color[0];
            padded_image.buf[i + 1] = pad_color[1];
            padded_image.buf[i + 2] = pad_color[2];
        }

        // Calculate padding offsets
        int pad_x = (target_width  - new_width)  / 2;
        int pad_y = (target_height - new_height) / 2;

        // Copy the resized image into the center of the padded buffer
        for (int y = 0; y < new_height; ++y) {
            for (int x = 0; x < new_width; ++x) {
                for (int c = 0; c < 3; ++c) {
                    padded_image.buf[3 * ((y + pad_y) * target_width + (x + pad_x)) + c] = resized_image.buf[3 * (y * new_width + x) + c];
                }
            }
        }
        dst = std::move(padded_image);
    }